

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstreams.cpp
# Opt level: O1

ssize_t __thiscall HPack::BitIStream::read(BitIStream *this,int __fd,void *__buf,size_t __nbytes)

{
  uchar *puVar1;
  ulong uVar2;
  QArrayData *pQVar3;
  bool bVar4;
  quint64 qVar5;
  long lVar6;
  ssize_t sVar7;
  size_t __nbytes_00;
  void *__buf_00;
  ssize_t sVar8;
  undefined4 in_register_00000034;
  QByteArray *outputBuffer;
  ulong uVar9;
  quint64 qVar10;
  long in_FS_OFFSET;
  quint32 len;
  uchar compressed;
  uint local_60;
  uchar local_59;
  BitIStream local_58;
  long local_30;
  
  outputBuffer = (QByteArray *)CONCAT44(in_register_00000034,__fd);
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  qVar10 = this->offset;
  local_59 = '\0';
  qVar5 = peekBits<unsigned_char>(this,qVar10,1,&local_59);
  if (((qVar5 != 1) || (lVar6 = ((long)this->last - (long)this->first) * 8, lVar6 == 0)) ||
     (lVar6 - 1U < this->offset)) {
    this->streamError = NotEnoughData;
    sVar8 = 0;
    goto LAB_001db63a;
  }
  __nbytes_00 = this->offset + 1;
  this->offset = __nbytes_00;
  sVar8 = 0;
  this->streamError = NoError;
  local_60 = 0;
  sVar7 = read(this,(int)&local_60,__buf_00,__nbytes_00);
  if ((char)sVar7 != '\0') {
    uVar9 = (ulong)local_60;
    puVar1 = this->first;
    uVar2 = this->offset;
    if (((long)this->last - (long)puVar1) * 8 - uVar2 >> 3 < uVar9) {
      this->streamError = NotEnoughData;
    }
    else {
      if (local_59 == '\0') {
        QByteArray::QByteArray((QByteArray *)&local_58,(char *)(puVar1 + (uVar2 >> 3)),uVar9);
        pQVar3 = &((outputBuffer->d).d)->super_QArrayData;
        puVar1 = (uchar *)(outputBuffer->d).ptr;
        (outputBuffer->d).d = (Data *)local_58.first;
        (outputBuffer->d).ptr = (char *)local_58.last;
        qVar10 = (outputBuffer->d).size;
        (outputBuffer->d).size = local_58.offset;
        local_58.first = (uchar *)pQVar3;
        local_58.last = puVar1;
        local_58.offset = qVar10;
        if (pQVar3 != (QArrayData *)0x0) {
          LOCK();
          (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar3,1,0x10);
          }
        }
        qVar10 = (ulong)local_60 * 8 + this->offset;
        sVar8 = 1;
        goto LAB_001db780;
      }
      local_58.first = puVar1 + (uVar2 >> 3);
      local_58.last =
           (uchar *)((long)&(((QArrayData *)local_58.first)->ref_)._q_value.super___atomic_base<int>
                            ._M_i + uVar9);
      local_58.offset = 0;
      local_58.streamError = NoError;
      local_58._28_4_ = 0xaaaaaaaa;
      bVar4 = huffman_decode_string(&local_58,outputBuffer);
      if (bVar4) {
        this->offset = this->offset + uVar9 * 8;
      }
      else {
        this->streamError = CompressionError;
      }
      sVar8 = 1;
      if (bVar4) goto LAB_001db63a;
    }
    sVar8 = 0;
  }
LAB_001db780:
  this->offset = qVar10;
LAB_001db63a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return sVar8;
  }
  __stack_chk_fail();
}

Assistant:

bool BitIStream::read(QByteArray *dstPtr)
{
    Q_ASSERT(dstPtr);
    QByteArray &dst = *dstPtr;
    //5.2 String Literal Representation
    //
    // Header field names and header field values can be represented as string literals.
    // A string literal is compressed as a sequence of octets, either by directly encoding
    // the string literal's octets or by using a Huffman code.

    // We update the offset _only_ if the read was successful.

    const quint64 oldOffset = offset;
    uchar compressed = 0;
    if (peekBits(offset, 1, &compressed) != 1 || !skipBits(1)) {
        setError(Error::NotEnoughData);
        return false;
    }

    setError(Error::NoError);

    quint32 len = 0;
    if (read(&len)) {
        Q_ASSERT(!(offset % 8));
        if (len <= (bitLength() - offset) / 8) { // We have enough data to read a string ...
            if (!compressed) {
                // Now good news, integer always ends on a byte boundary.
                // We can read 'len' bytes without any bit magic.
                const char *src = reinterpret_cast<const char *>(first + offset / 8);
                dst = QByteArray(src, len);
                offset += quint64(len) * 8;
                return true;
            }

            BitIStream slice(first + offset / 8, first + offset / 8 + len);
            if (huffman_decode_string(slice, &dst)) {
                offset += quint64(len) * 8;
                return true;
            }

            setError(Error::CompressionError);
        } else {
            setError(Error::NotEnoughData);
        }
    } // else the exact reason was set by read(quint32).

    offset = oldOffset;
    return false;
}